

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IIR2xResampler.cpp
# Opt level: O3

void __thiscall
SRCTools::IIR2xInterpolator::process
          (IIR2xInterpolator *this,FloatSample **inSamples,uint *inLength,FloatSample **outSamples,
          uint *outLength)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  IIRSection *pIVar4;
  FloatSample *pFVar5;
  long lVar6;
  uint uVar7;
  bool bVar8;
  uint uVar9;
  SectionBuffer *paBVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  
  uVar7 = *outLength;
  if ((uVar7 != 0) && (*inLength != 0)) {
    uVar9 = this->phase;
    do {
      paBVar10 = (this->super_IIRResampler).constants.buffer;
      uVar3 = (this->super_IIRResampler).constants.sectionsCount;
      lVar11 = 0;
      bVar13 = true;
      do {
        bVar8 = bVar13;
        fVar1 = (*inSamples)[lVar11];
        fVar14 = 0.0;
        if (uVar9 != 0) {
          fVar14 = (this->super_IIRResampler).constants.fir * fVar1;
        }
        if (uVar3 != 0) {
          fVar2 = this->lastInputSamples[lVar11];
          pIVar4 = (this->super_IIRResampler).constants.sections;
          lVar6 = 0;
          do {
            lVar12 = lVar6;
            fVar15 = *(float *)((long)*paBVar10 + lVar12 + 4);
            if (uVar9 == 0) {
              fVar15 = ((*(float *)((long)&pIVar4->num1 + lVar12 * 2) * fVar2 + 1e-20) -
                       *(float *)((long)&pIVar4->den1 + lVar12 * 2) *
                       *(float *)((long)*paBVar10 + lVar12)) -
                       fVar15 * *(float *)((long)&pIVar4->den2 + lVar12 * 2);
              *(float *)((long)*paBVar10 + lVar12 + 4) = fVar15;
            }
            else {
              fVar15 = ((*(float *)((long)&pIVar4->num2 + lVar12 * 2) * fVar2 + 1e-20) -
                       fVar15 * *(float *)((long)&pIVar4->den1 + lVar12 * 2)) -
                       *(float *)((long)&pIVar4->den2 + lVar12 * 2) *
                       *(float *)((long)*paBVar10 + lVar12);
              *(float *)((long)*paBVar10 + lVar12) = fVar15;
            }
            fVar14 = fVar14 + fVar15;
            lVar6 = lVar12 + 8;
          } while ((ulong)uVar3 << 3 != lVar12 + 8);
          paBVar10 = (SectionBuffer *)((long)paBVar10[1] + lVar12);
        }
        pFVar5 = *outSamples;
        *outSamples = pFVar5 + 1;
        *pFVar5 = fVar14 + fVar14;
        if (uVar9 != 0) {
          this->lastInputSamples[lVar11] = fVar1;
        }
        lVar11 = 1;
        bVar13 = false;
      } while (bVar8);
      *outLength = uVar7 - 1;
      bVar13 = this->phase == 0;
      if (!bVar13) {
        *inSamples = *inSamples + 2;
        *inLength = *inLength - 1;
      }
      uVar9 = (uint)bVar13;
      this->phase = uVar9;
      uVar7 = *outLength;
    } while ((uVar7 != 0) && (*inLength != 0));
  }
  return;
}

Assistant:

void IIR2xInterpolator::process(const FloatSample *&inSamples, unsigned int &inLength, FloatSample *&outSamples, unsigned int &outLength) {
	static const IIRCoefficient INTERPOLATOR_AMP = 2.0;

	while (outLength > 0 && inLength > 0) {
		SectionBuffer *bufferp = constants.buffer;
		for (unsigned int chIx = 0; chIx < IIR_RESAMPER_CHANNEL_COUNT; ++chIx) {
			const FloatSample lastInputSample = lastInputSamples[chIx];
			const FloatSample inSample = inSamples[chIx];
			BufferedSample tmpOut = phase == 0 ? 0 : inSample * constants.fir;
			for (unsigned int i = 0; i < constants.sectionsCount; ++i) {
				const IIRSection &section = constants.sections[i];
				SectionBuffer &buffer = *bufferp;
				// For 2x interpolation, calculation of the numerator reduces to a single multiplication depending on the phase.
				if (phase == 0) {
					const BufferedSample numOutSample = section.num1 * lastInputSample;
					const BufferedSample denOutSample = calcDenominator(section, BIAS + numOutSample, buffer[0], buffer[1]);
					buffer[1] = denOutSample;
					tmpOut += denOutSample;
				} else {
					const BufferedSample numOutSample = section.num2 * lastInputSample;
					const BufferedSample denOutSample = calcDenominator(section, BIAS + numOutSample, buffer[1], buffer[0]);
					buffer[0] = denOutSample;
					tmpOut += denOutSample;
				}
				bufferp++;
			}
			*(outSamples++) = FloatSample(INTERPOLATOR_AMP * tmpOut);
			if (phase > 0) {
				lastInputSamples[chIx] = inSample;
			}
		}
		outLength--;
		if (phase > 0) {
			inSamples += IIR_RESAMPER_CHANNEL_COUNT;
			inLength--;
			phase = 0;
		} else {
			phase = 1;
		}
	}
}